

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

BroadcastToStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_broadcasttostatic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x451) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x451;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    BroadcastToStaticLayerParams::BroadcastToStaticLayerParams(this_00.broadcasttostatic_);
    (this->layer_).broadcasttostatic_ = (BroadcastToStaticLayerParams *)this_00;
  }
  return (BroadcastToStaticLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToStaticLayerParams* NeuralNetworkLayer::mutable_broadcasttostatic() {
  if (!has_broadcasttostatic()) {
    clear_layer();
    set_has_broadcasttostatic();
    layer_.broadcasttostatic_ = new ::CoreML::Specification::BroadcastToStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.broadcastToStatic)
  return layer_.broadcasttostatic_;
}